

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O0

void __thiscall OpenMesh::IO::_OMReader_::_OMReader_(_OMReader_ *this)

{
  _IOManager_ *this_00;
  _OMReader_ *this_local;
  
  BaseReader::BaseReader(&this->super_BaseReader);
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___OMReader__003de150;
  Options::Options(&this->fileOptions_);
  OMFormat::Chunk::PropertyName::PropertyName(&this->property_name_);
  this_00 = IOManager();
  _IOManager_::register_module(this_00,&this->super_BaseReader);
  return;
}

Assistant:

_OMReader_::_OMReader_()
{
  IOManager().register_module(this);
}